

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  BYTE *ip;
  ulong *puVar9;
  BYTE *ostart;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  
  uVar5 = 0;
  if (dstSize < 8) {
    return 0;
  }
  if (dstSize == 8) {
    return 0;
  }
  puVar9 = (ulong *)((long)dst + (dstSize - 8));
  uVar10 = srcSize & 0xfffffffffffffffc;
  uVar7 = (uint)srcSize & 3;
  uVar8 = (ulong)uVar7;
  switch(uVar7) {
  case 0:
    puVar11 = (ulong *)dst;
    goto joined_r0x00189c5a;
  case 1:
    uVar8 = 0;
    goto LAB_00189c1c;
  case 2:
    uVar8 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar10 + 2);
    uVar8 = (ulong)CTable[bVar1].val;
    uVar5 = (ulong)CTable[bVar1].nbBits;
  }
  bVar1 = *(byte *)((long)src + uVar10 + 1);
  uVar8 = (ulong)CTable[bVar1].val << (uVar5 & 0x3f) | uVar8;
  uVar5 = (ulong)((uint)CTable[bVar1].nbBits + (int)uVar5);
LAB_00189c1c:
  uVar8 = (ulong)CTable[*(byte *)((long)src + uVar10)].val << (uVar5 & 0x3f) | uVar8;
  uVar7 = (uint)CTable[*(byte *)((long)src + uVar10)].nbBits + (int)uVar5;
  *(ulong *)dst = uVar8;
  puVar11 = (ulong *)((ulong)(uVar7 >> 3) + (long)dst);
  if (puVar9 < puVar11) {
    puVar11 = puVar9;
  }
  uVar5 = (ulong)(uVar7 & 7);
  uVar8 = uVar8 >> ((ulong)((byte)uVar7 & 0xf8) & 0x3f);
joined_r0x00189c5a:
  for (; uVar10 != 0; uVar10 = uVar10 - 4) {
    bVar1 = *(byte *)((long)src + (uVar10 - 1));
    uVar12 = (uint)CTable[bVar1].nbBits + (int)uVar5;
    bVar2 = *(byte *)((long)src + (uVar10 - 2));
    uVar7 = CTable[bVar2].nbBits + uVar12;
    bVar3 = *(byte *)((long)src + (uVar10 - 3));
    uVar13 = CTable[bVar3].nbBits + uVar7;
    bVar4 = *(byte *)((long)src + (uVar10 - 4));
    uVar8 = (ulong)CTable[bVar4].val << ((ulong)uVar13 & 0x3f) |
            (ulong)CTable[bVar3].val << ((ulong)uVar7 & 0x3f) |
            (ulong)CTable[bVar2].val << ((ulong)uVar12 & 0x3f) |
            (ulong)CTable[bVar1].val << uVar5 | uVar8;
    uVar13 = CTable[bVar4].nbBits + uVar13;
    puVar14 = (ulong *)((ulong)(uVar13 >> 3) + (long)puVar11);
    if (puVar9 < puVar14) {
      puVar14 = puVar9;
    }
    uVar5 = (ulong)(uVar13 & 7);
    *puVar11 = uVar8;
    uVar8 = uVar8 >> ((ulong)((byte)uVar13 & 0xf8) & 0x3f);
    puVar11 = puVar14;
  }
  uVar7 = (int)uVar5 + 1;
  puVar14 = (ulong *)((ulong)(uVar7 >> 3) + (long)puVar11);
  if (puVar9 < puVar14) {
    puVar14 = puVar9;
  }
  *puVar11 = uVar8 | 1L << uVar5;
  sVar6 = 0;
  if (puVar14 < puVar9) {
    sVar6 = (long)puVar14 - ((long)dst + ((ulong)((uVar7 & 7) == 0) - 1));
  }
  return sVar6;
}

Assistant:

size_t
HUF_compress1X_usingCTable_internal_bmi2(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    return HUF_compress1X_usingCTable_internal_body(dst, dstSize, src, srcSize, CTable);
}